

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
     ::Finalize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state,
               AggregateFinalizeData *finalize_data)

{
  OrderModifiers in_R9W;
  string_t sort_key;
  
  if (((state->super_ArgMinMaxStateBase).is_initialized == true) &&
     ((state->super_ArgMinMaxStateBase).arg_null != true)) {
    sort_key.value.pointer.ptr = (char *)finalize_data->result;
    sort_key.value._0_8_ = (state->arg).value.pointer.ptr;
    CreateSortKeyHelpers::DecodeSortKey
              (*(CreateSortKeyHelpers **)&(state->arg).value,sort_key,
               (Vector *)finalize_data->result_idx,0x302,in_R9W);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, AggregateFinalizeData &finalize_data) {
		if (!state.is_initialized || state.arg_null) {
			finalize_data.ReturnNull();
		} else {
			CreateSortKeyHelpers::DecodeSortKey(state.arg, finalize_data.result, finalize_data.result_idx,
			                                    OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST));
		}
	}